

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O2

void __thiscall zmq::plain_server_t::~plain_server_t(plain_server_t *this)

{
  zap_client_t::~zap_client_t((zap_client_t *)this,&PTR_construction_vtable_24__0024b388);
  mechanism_t::~mechanism_t
            ((mechanism_t *)
             &(this->super_zap_client_common_handshake_t).super_zap_client_t.field_0x50);
  return;
}

Assistant:

zmq::plain_server_t::~plain_server_t ()
{
}